

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O0

BigInt * __thiscall BigInt::operator/(BigInt *__return_storage_ptr__,BigInt *this,BigInt *v)

{
  BigInt local_a0;
  BigInt local_80;
  pair<BigInt,_BigInt> local_60;
  BigInt *local_20;
  BigInt *v_local;
  BigInt *this_local;
  
  local_20 = v;
  v_local = this;
  this_local = __return_storage_ptr__;
  BigInt(&local_80,this);
  BigInt(&local_a0,local_20);
  divModBig(&local_60,&local_80,&local_a0);
  BigInt(__return_storage_ptr__,&local_60.first);
  std::pair<BigInt,_BigInt>::~pair(&local_60);
  ~BigInt(&local_a0);
  ~BigInt(&local_80);
  return __return_storage_ptr__;
}

Assistant:

BigInt operator/(const BigInt &v) const {
        return divModBig(*this, v).first;
    }